

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v4_text.cc
# Opt level: O3

void __thiscall
lf::io::anon_unknown_0::
MshV4GrammarText<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::MshV4GrammarText(MshV4GrammarText<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *this)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string *this_00;
  string *this_01;
  string *this_02;
  function_type *this_03;
  function_type *this_04;
  function_type *other;
  function_type *other_00;
  vtable_base *pvVar3;
  undefined8 uVar4;
  typeinfo *ptVar5;
  function_buffer *pfVar6;
  ulong_long_type size_t_;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[10]>_>_>,_0L>
  that_1;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[15]>_>_>,_0L>
  that;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[7]>_>_>,_0L>
  that_3;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[21]>_>_>,_0L>
  that_2;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[15]>_>_>,_0L>
  that_6;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[10]>_>_>,_0L>
  that_5;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[10]>_>_>,_0L>
  that_4;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  that_7;
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined8 local_3e8;
  car_type local_3e0;
  undefined1 local_3c9;
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  local_3c8;
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  local_3a8;
  cdr_type local_388;
  undefined1 local_384;
  string *local_380;
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  local_378;
  cdr_type local_358;
  undefined1 local_354;
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  local_350;
  vtable_base local_330;
  proto_child0 local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  local_310;
  cdr_type local_2f0;
  undefined1 local_2ec;
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  local_2e8;
  cdr_type local_2c8;
  undefined1 local_2c4;
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  local_2c0;
  cdr_type local_2a0;
  undefined1 local_29c;
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  local_298;
  cdr_type local_278;
  undefined1 local_274;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_260;
  vtable_base local_258;
  function_buffer *local_250;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_248;
  size_type *local_240;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  *local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  proto_child0 local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  vtable_base local_210;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PartitionedEntity_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_208;
  undefined1 local_1fb [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  local_1f0;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::NodeBlock_(),_boost::spirit::locals<unsigned_long,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  *local_1a8;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>_(),_boost::spirit::locals<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  *local_1a0;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  *local_198;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PartitionedEntity_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_190;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_188;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_180;
  proto_child0 local_178;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  local_170;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
  local_128;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::ElementBlock_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  *local_120;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV4::PhysicalName,_std::allocator<lf::io::GMshFileV4::PhysicalName>_>_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  *local_118;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PartitionedPointEntity_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_110;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV4::GhostEntity,_std::allocator<lf::io::GMshFileV4::GhostEntity>_>_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  *local_108;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
  local_100;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Entity_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_f8;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PointEntity_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_f0;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PhysicalName_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_e8;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_e0;
  undefined1 local_d6 [3];
  undefined1 local_d3 [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Msh File","");
  local_188 = &this->entry_;
  (this->
  super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_188;
  psVar1 = &(this->
            super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
            ).name_;
  paVar2 = &(this->
            super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
            ).name_.field_2;
  (this->
  super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).name_._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar1,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_e0 = &this->quoted_string_;
  (this->quoted_string_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_e0;
  this_00 = &(this->quoted_string_).name_;
  (this->quoted_string_).name_._M_dataplus._M_p = (pointer)&(this->quoted_string_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this_00,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->quoted_string_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_180 = &this->start_comment_;
  (this->start_comment_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_180;
  this_01 = &(this->start_comment_).name_;
  (this->start_comment_).name_._M_dataplus._M_p = (pointer)&(this->start_comment_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this_01,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->start_comment_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_100.child0.ref.t_ = (proto_child0)&this->comment_;
  (this->comment_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_100.child0.ref.t_;
  this_02 = &(this->comment_).name_;
  (this->comment_).name_._M_dataplus._M_p = (pointer)&(this->comment_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this_02,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->comment_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_260 = &this->vec3_;
  (this->vec3_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_260;
  (this->vec3_).name_._M_dataplus._M_p = (pointer)&(this->vec3_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->vec3_).name_,local_408._0_8_,
             (pointer)(local_408._8_8_ + local_408._0_8_));
  (this->vec3_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_238 = &this->int_vec_;
  (this->int_vec_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_238;
  (this->int_vec_).name_._M_dataplus._M_p = (pointer)&(this->int_vec_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->int_vec_).name_,local_408._0_8_,
             (pointer)(local_408._8_8_ + local_408._0_8_));
  (this->int_vec_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<int,_std::allocator<int>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  local_380 = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_e8 = &this->physical_name_;
  (this->physical_name_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PhysicalName_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PhysicalName_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_e8;
  psVar1 = &(this->physical_name_).name_;
  (this->physical_name_).name_._M_dataplus._M_p = (pointer)&(this->physical_name_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar1,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->physical_name_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_118 = &this->physical_name_vector_;
  (this->physical_name_vector_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV4::PhysicalName,_std::allocator<lf::io::GMshFileV4::PhysicalName>_>_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV4::PhysicalName,_std::allocator<lf::io::GMshFileV4::PhysicalName>_>_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_118;
  local_38 = &(this->physical_name_vector_).name_;
  (this->physical_name_vector_).name_._M_dataplus._M_p =
       (pointer)&(this->physical_name_vector_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->physical_name_vector_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV4::PhysicalName,_std::allocator<lf::io::GMshFileV4::PhysicalName>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  (this->entry_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_188;
  local_90 = &(this->entry_).name_;
  (this->entry_).name_._M_dataplus._M_p = (pointer)&(this->entry_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->entry_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_f0 = &this->point_entity_;
  (this->point_entity_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PointEntity_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PointEntity_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_f0;
  local_40 = &(this->point_entity_).name_;
  (this->point_entity_).name_._M_dataplus._M_p = (pointer)&(this->point_entity_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->point_entity_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PointEntity_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_f8 = &this->entity_;
  (this->entity_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Entity_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Entity_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_f8;
  local_48 = &(this->entity_).name_;
  (this->entity_).name_._M_dataplus._M_p = (pointer)&(this->entity_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->entity_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Entity_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_198 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
               *)&this->entities_;
  (this->entities_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_(),_boost::spirit::locals<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_(),_boost::spirit::locals<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_(),_boost::spirit::locals<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
        *)local_198;
  local_50 = &(this->entities_).name_;
  (this->entities_).name_._M_dataplus._M_p = (pointer)&(this->entities_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->entities_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_108 = &this->ghost_entities_;
  (this->ghost_entities_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV4::GhostEntity,_std::allocator<lf::io::GMshFileV4::GhostEntity>_>_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV4::GhostEntity,_std::allocator<lf::io::GMshFileV4::GhostEntity>_>_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_108;
  local_58 = &(this->ghost_entities_).name_;
  (this->ghost_entities_).name_._M_dataplus._M_p = (pointer)&(this->ghost_entities_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->ghost_entities_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV4::GhostEntity,_std::allocator<lf::io::GMshFileV4::GhostEntity>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_110 = &this->partitioned_point_entity_;
  (this->partitioned_point_entity_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PartitionedPointEntity_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PartitionedPointEntity_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_110;
  local_60 = &(this->partitioned_point_entity_).name_;
  (this->partitioned_point_entity_).name_._M_dataplus._M_p =
       (pointer)&(this->partitioned_point_entity_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->partitioned_point_entity_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PartitionedPointEntity_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_190 = &this->partitioned_entity_;
  (this->partitioned_entity_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PartitionedEntity_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PartitionedEntity_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_190;
  local_68 = &(this->partitioned_entity_).name_;
  (this->partitioned_entity_).name_._M_dataplus._M_p =
       (pointer)&(this->partitioned_entity_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->partitioned_entity_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PartitionedEntity_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_1a0 = &this->partitioned_entities2_;
  (this->partitioned_entities2_).super_extends<_9e970549_>.proto_expr_.child0.ref.t_ = local_1a0;
  local_70 = &(this->partitioned_entities2_).name_;
  (this->partitioned_entities2_).name_._M_dataplus._M_p =
       (pointer)&(this->partitioned_entities2_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->partitioned_entities2_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  local_d0 = paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_128.child0.ref.t_ = (proto_child0)&this->partitioned_entities_;
  (this->partitioned_entities_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PartitionedEntities_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PartitionedEntities_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PartitionedEntities_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_128.child0.ref.t_;
  local_78 = &(this->partitioned_entities_).name_;
  (this->partitioned_entities_).name_._M_dataplus._M_p =
       (pointer)&(this->partitioned_entities_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->partitioned_entities_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PartitionedEntities_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_1a8 = &this->node_block_;
  (this->node_block_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::NodeBlock_(),_boost::spirit::locals<unsigned_long,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::NodeBlock_(),_boost::spirit::locals<unsigned_long,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_1a8;
  local_80 = &(this->node_block_).name_;
  (this->node_block_).name_._M_dataplus._M_p = (pointer)&(this->node_block_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->node_block_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::NodeBlock_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_1f0.f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Nodes_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.functor._16_8_ = &this->nodes_;
  (this->nodes_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
        *)local_1f0.f.
          super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Nodes_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
          .super_function_base.functor._16_8_;
  local_88 = &(this->nodes_).name_;
  (this->nodes_).name_._M_dataplus._M_p = (pointer)&(this->nodes_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->nodes_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Nodes_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_120 = &this->element_block_;
  (this->element_block_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::ElementBlock_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::ElementBlock_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_120;
  local_98 = &(this->element_block_).name_;
  (this->element_block_).name_._M_dataplus._M_p = (pointer)&(this->element_block_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->element_block_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::ElementBlock_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_1f0.f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Nodes_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.functor._8_8_ = &this->elements_;
  (this->elements_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Elements_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Elements_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Elements_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
        *)local_1f0.f.
          super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Nodes_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
          .super_function_base.functor._8_8_;
  local_a0 = &(this->elements_).name_;
  (this->elements_).name_._M_dataplus._M_p = (pointer)&(this->elements_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a0,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->elements_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Elements_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_170.f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.functor._16_8_ = &this->matrix4d_;
  (this->matrix4d_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_170.f.
          super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
          .super_function_base.functor._16_8_;
  local_a8 = &(this->matrix4d_).name_;
  (this->matrix4d_).name_._M_dataplus._M_p = (pointer)&(this->matrix4d_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->matrix4d_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<Eigen::Matrix<double,_4,_4,_0,_4,_4>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_170.f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.functor._8_8_ = &this->periodic_link_;
  (this->periodic_link_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PeriodicLink_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PeriodicLink_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PeriodicLink_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
        *)local_170.f.
          super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
          .super_function_base.functor._8_8_;
  local_b0 = &(this->periodic_link_).name_;
  (this->periodic_link_).name_._M_dataplus._M_p = (pointer)&(this->periodic_link_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->periodic_link_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PeriodicLink_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_170.f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.functor.members.obj_ptr = &this->periodic_links_;
  (this->periodic_links_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV4::PeriodicLink,_std::allocator<lf::io::GMshFileV4::PeriodicLink>_>_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV4::PeriodicLink,_std::allocator<lf::io::GMshFileV4::PeriodicLink>_>_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV4::PeriodicLink,_std::allocator<lf::io::GMshFileV4::PeriodicLink>_>_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
        *)local_170.f.
          super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
          .super_function_base.functor.members._0_8_;
  local_b8 = &(this->periodic_links_).name_;
  (this->periodic_links_).name_._M_dataplus._M_p = (pointer)&(this->periodic_links_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b8,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->periodic_links_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV4::PeriodicLink,_std::allocator<lf::io::GMshFileV4::PeriodicLink>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_170.f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)&this->ghost_element_;
  (this->ghost_element_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::GhostElement_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::GhostElement_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::GhostElement_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
        *)local_170.f.
          super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
          .super_function_base.vtable;
  local_c0 = &(this->ghost_element_).name_;
  (this->ghost_element_).name_._M_dataplus._M_p = (pointer)&(this->ghost_element_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c0,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->ghost_element_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::GhostElement_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"unnamed-rule","");
  local_170.name_.field_2._8_8_ = &this->ghost_elements_;
  (this->ghost_elements_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV4::GhostElement,_std::allocator<lf::io::GMshFileV4::GhostElement>_>_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV4::GhostElement,_std::allocator<lf::io::GMshFileV4::GhostElement>_>_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV4::GhostElement,_std::allocator<lf::io::GMshFileV4::GhostElement>_>_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
        *)local_170.name_.field_2._8_8_;
  local_c8 = &(this->ghost_elements_).name_;
  (this->ghost_elements_).name_._M_dataplus._M_p = (pointer)&(this->ghost_elements_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_));
  (this->ghost_elements_).f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV4::GhostElement,_std::allocator<lf::io::GMshFileV4::GhostElement>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_3c9 = boost::spirit::ulong_long;
  local_408._0_4_ = 0x22220022;
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
               *)&(this->quoted_string_).f,
              (parser_binder<boost::spirit::qi::lexeme_directive<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::plus<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>_>_>,_boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::nil_>_>_>_>_>,_mpl_::bool_<true>_>
               *)local_408);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"string","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408)
  ;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<Eigen::Matrix<double,3,1,0,3,1>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<Eigen::Matrix<double,3,1,0,3,1>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
               *)&(this->vec3_).f,
              (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::nil_>_>_>_>,_mpl_::bool_<true>_>
               *)local_408);
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<std::vector<int,std::allocator<int>>&,boost::fusion::nil_>,boost::fusion::vector<unsigned_long>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<std::vector<int,std::allocator<int>>&,boost::fusion::nil_>,boost::fusion::vector<unsigned_long>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
               *)&(this->int_vec_).f,
              (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::omit_directive<boost::spirit::qi::action<boost::spirit::qi::any_uint_parser<unsigned_long_long,_10U,_1U,__1>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::local_variable<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_2L>_>_>_>,_boost::fusion::cons<boost::spirit::qi::lazy_directive<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::spirit::local_variable<0>_>_>,_2L>_>,_boost::spirit::qi::any_int_parser<int,_10U,_1U,__1>,_boost::spirit::unused_type>,_boost::fusion::nil_>_>_>,_mpl_::bool_<true>_>
               *)local_408);
  local_210.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &local_350;
  local_350.super_function_base.vtable = (vtable_base *)0x313fec;
  local_3a8.super_function_base.vtable = &local_210;
  local_1f0.name_._M_string_length = (size_type)&local_3c8;
  local_3c8.super_function_base.vtable = (vtable_base *)0x321804;
  local_3a8.super_function_base.functor.members._0_8_ = (undefined8)((long)&local_1f0 + 0x10);
  local_378.super_function_base.vtable = (vtable_base *)&local_3a8;
  local_1f0.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>
        )&local_320;
  local_320._M_allocated_capacity = (size_type)"$PartitionedEntities";
  local_378.super_function_base.functor.members.obj_ptr = &local_1f0;
  local_310.super_function_base.vtable = (vtable_base *)&local_378;
  local_310.super_function_base.functor.members.obj_ptr = &local_170.name_._M_string_length;
  local_2e8.super_function_base.vtable = (vtable_base *)&local_310;
  local_2e8.super_function_base.functor.members.obj_ptr = &local_170;
  local_2c0.super_function_base.vtable = (vtable_base *)&local_2e8;
  local_2c0.super_function_base.functor.members.obj_ptr =
       &local_1f0.f.
        super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Nodes_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
        .super_function_base.functor;
  local_298.super_function_base.vtable = (vtable_base *)&local_2c0;
  local_298.super_function_base.functor.members._0_8_ = (undefined8)((long)&local_1f0 + 0x28);
  local_408._0_8_ = &local_298;
  local_1f0.name_.field_2._8_8_ = &local_230;
  local_230._M_allocated_capacity = (size_type)&boost::spirit::standard::char_;
  local_230._8_8_ = &boost::spirit::eol;
  local_170.name_._M_string_length = (size_type)&local_330;
  local_330.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)0x313ffb
  ;
  local_170.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_248;
  local_248.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(proto_child0)0x3139d6;
  local_1f0.f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Nodes_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.functor.members.obj_ptr = &local_258;
  local_258.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)0x314002
  ;
  local_1f0.f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Nodes_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)&local_270;
  local_270._M_allocated_capacity = (size_type)"$GhostElements";
  local_220.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_1f8;
  local_1f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1f8._1_7_,0x24);
  local_218 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)&local_1f0 + 0x20);
  local_408._8_8_ = &local_220;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[15]>>>,0l>const&>,1l>const&,___oost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>const&>,1l>const&>,2l>const&>,2l>>
            (local_180);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Start of Comment","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408)
  ;
  this_03 = &(this->comment_).f;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_408._0_8_ =
       (local_180->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  local_3f8._0_2_ = 0x2400;
  local_3f8._8_8_ = "$End";
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type&,boost::fusion::nil_>,boost::fusion::vector<std::__cxx11::string>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type&,boost::fusion::nil_>,boost::fusion::vector<std::__cxx11::string>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
               *)this_03,
              (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::action<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::local_variable<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>_>_>,_boost::fusion::cons<boost::spirit::qi::literal_string<const_char_(&)[5],_true>,_boost::fusion::cons<boost::spirit::qi::lazy_parser<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>,_boost::phoenix::actor<boost::spirit::local_variable<0>_>_>,_2L>_>,_boost::spirit::unused_type>,_boost::fusion::nil_>_>_>_>,_boost::fusion::nil_>_>_>,_mpl_::bool_<true>_>
               *)local_408);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"comment","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408)
  ;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
  }
  local_3c8.super_function_base.vtable = (vtable_base *)0x0;
  pvVar3 = (this_03->
           super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
           ).super_function_base.vtable;
  if (pvVar3 == (vtable_base *)0x0) {
LAB_00245ad1:
    local_3a8.super_function_base.vtable = (vtable_base *)0x0;
    local_378.super_function_base.vtable = (vtable_base *)0x0;
  }
  else {
    pfVar6 = &(this->comment_).f.
              super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
              .super_function_base.functor;
    local_3c8.super_function_base.vtable = pvVar3;
    if (((ulong)pvVar3 & 1) == 0) {
      (*pvVar3->manager)(pfVar6,&local_3c8.super_function_base.functor,clone_functor_tag);
      if (local_3c8.super_function_base.vtable == (vtable_base *)0x0) goto LAB_00245ad1;
    }
    else {
      local_3c8.super_function_base.functor._16_8_ =
           *(undefined8 *)
            ((long)&(this->comment_).f.
                    super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                    .super_function_base.functor + 0x10);
      local_3c8.super_function_base.functor.members._0_8_ = (undefined8)*(undefined8 *)pfVar6;
      local_3c8.super_function_base.functor._8_4_ =
           *(undefined4 *)
            ((long)&(this->comment_).f.
                    super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                    .super_function_base.functor + 8);
      local_3c8.super_function_base.functor._12_4_ =
           *(undefined4 *)
            ((long)&(this->comment_).f.
                    super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                    .super_function_base.functor + 0xc);
    }
    local_3a8.super_function_base.vtable = local_3c8.super_function_base.vtable;
    if (((ulong)local_3c8.super_function_base.vtable & 1) == 0) {
      (*(local_3c8.super_function_base.vtable)->manager)
                (&local_3c8.super_function_base.functor,&local_3a8.super_function_base.functor,
                 clone_functor_tag);
      local_378.super_function_base.vtable = (vtable_base *)0x0;
      if (local_3a8.super_function_base.vtable == (vtable_base *)0x0) goto LAB_00245b69;
    }
    else {
      local_3a8.super_function_base.functor._16_8_ = local_3c8.super_function_base.functor._16_8_;
      local_3a8.super_function_base.functor.members.obj_ptr =
           local_3c8.super_function_base.functor.members.obj_ptr;
      local_3a8.super_function_base.functor._8_4_ = local_3c8.super_function_base.functor._8_4_;
      local_3a8.super_function_base.functor._12_4_ = local_3c8.super_function_base.functor._12_4_;
    }
    local_378.super_function_base.vtable = local_3a8.super_function_base.vtable;
    if (((ulong)local_3a8.super_function_base.vtable & 1) == 0) {
      (*(local_3a8.super_function_base.vtable)->manager)
                (&local_3a8.super_function_base.functor,&local_378.super_function_base.functor,
                 clone_functor_tag);
    }
    else {
      local_378.super_function_base.functor._16_8_ = local_3a8.super_function_base.functor._16_8_;
      local_378.super_function_base.functor._8_8_ =
           CONCAT44(local_3a8.super_function_base.functor._12_4_,
                    local_3a8.super_function_base.functor._8_4_);
      local_378.super_function_base.functor.members.obj_ptr =
           local_3a8.super_function_base.functor.members.obj_ptr;
    }
  }
LAB_00245b69:
  local_354 = local_384;
  local_358 = local_388;
  local_310.super_function_base.vtable = (vtable_base *)0x0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign(&local_310,&local_378);
  local_2ec = local_354;
  local_2f0 = local_358;
  local_350.super_function_base.vtable = (vtable_base *)0x0;
  local_2e8.super_function_base.vtable = (vtable_base *)0x0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign(&local_2e8,&local_310);
  local_2c4 = local_2ec;
  local_2c8 = local_2f0;
  local_2c0.super_function_base.vtable = (vtable_base *)0x0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign(&local_2c0,&local_2e8);
  local_29c = local_2c4;
  local_2a0 = local_2c8;
  local_298.super_function_base.vtable = (vtable_base *)0x0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign(&local_298,&local_2c0);
  local_274 = local_29c;
  local_278 = local_2a0;
  local_408._0_8_ = (pointer)0x0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)local_408,&local_298);
  local_3e8._4_1_ = (typeinfo)local_274;
  local_3e8._0_4_ = local_278;
  ptVar5 = (typeinfo *)operator_new(0x28);
  *(undefined8 *)ptVar5 = 0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)ptVar5,
                (function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)local_408);
  ptVar5[0x24] = local_3e8._4_1_;
  *(cdr_type *)(ptVar5 + 0x20) = local_3e8._0_4_;
  local_350.super_function_base.functor.members.type.type = ptVar5;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)local_408);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n(&local_298);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n(&local_2c0);
  local_350.super_function_base.vtable =
       (vtable_base *)
       boost::
       function_n<bool,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type&,boost::fusion::nil_>,boost::fusion::vector<std::__cxx11::string>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&>
       ::
       assign_to<boost::spirit::qi::error_handler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type&,boost::fusion::nil_>,boost::fusion::vector<std::__cxx11::string>>,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list5<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<lf::io::(anonymous_namespace)::MshV4GrammarText<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::ErrorHandler>,0l>,boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::spirit::argument<1>>,boost::phoenix::actor<boost::spirit::argument<2>>,boost::phoenix::actor<boost::spirit::argument<3>>>,5l>>,(boost::spirit::qi::error_handler_result)0>>(boost::spirit::qi::error_handler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type&,boost::fusion::nil_>,boost::fusion::vector<std::__cxx11::string>>,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list5<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<lf::io::(anonymous_namespace)::MshV4GrammarText<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::ErrorHandler>,long>,boost::phoenix::actor<boost::spirit::argument<int>>,boost::phoenix::actor<boost::spirit::argument<int>>,boost::phoenix::actor<boost::spirit::argument<int>>,boost::phoenix::actor<boost::spirit::argument<int>>>,long>>,(boost::spirit::qi::error_handler_result)0>)
       ::stored_vtable_abi_cxx11_;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n(&local_2e8);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n(&local_310);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::swap(&local_350,
         &this_03->
          super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
        );
  this_04 = &(this->physical_name_).f;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n(&local_350);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n(&local_378);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n(&local_3a8);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n(&local_3c8);
  local_3f8._0_8_ =
       (local_e0->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
               *)this_04,
              (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::any_int_parser<int,_10U,_1U,__1>,_boost::fusion::cons<boost::spirit::qi::any_int_parser<int,_10U,_1U,__1>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::nil_>_>_>_>,_mpl_::bool_<true>_>
               *)local_408);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Physical Name","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (psVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408);
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  local_3c8.super_function_base.vtable = (vtable_base *)0x0;
  pvVar3 = (this_04->
           super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
           ).super_function_base.vtable;
  if (pvVar3 == (vtable_base *)0x0) {
LAB_00245dd6:
    local_3a8.super_function_base.vtable = (vtable_base *)0x0;
    local_378.super_function_base.vtable = (vtable_base *)0x0;
  }
  else {
    pfVar6 = &(this->physical_name_).f.
              super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
              .super_function_base.functor;
    local_3c8.super_function_base.vtable = pvVar3;
    if (((ulong)pvVar3 & 1) == 0) {
      (*pvVar3->manager)(pfVar6,&local_3c8.super_function_base.functor,clone_functor_tag);
      if (local_3c8.super_function_base.vtable == (vtable_base *)0x0) goto LAB_00245dd6;
    }
    else {
      local_3c8.super_function_base.functor._16_8_ =
           *(undefined8 *)
            ((long)&(this->physical_name_).f.
                    super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                    .super_function_base.functor + 0x10);
      local_3c8.super_function_base.functor.members._0_8_ = (undefined8)*(undefined8 *)pfVar6;
      local_3c8.super_function_base.functor._8_4_ =
           *(undefined4 *)
            ((long)&(this->physical_name_).f.
                    super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                    .super_function_base.functor + 8);
      local_3c8.super_function_base.functor._12_4_ =
           *(undefined4 *)
            ((long)&(this->physical_name_).f.
                    super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                    .super_function_base.functor + 0xc);
    }
    local_3a8.super_function_base.vtable = local_3c8.super_function_base.vtable;
    if (((ulong)local_3c8.super_function_base.vtable & 1) == 0) {
      (*(local_3c8.super_function_base.vtable)->manager)
                (&local_3c8.super_function_base.functor,&local_3a8.super_function_base.functor,
                 clone_functor_tag);
      local_378.super_function_base.vtable = (vtable_base *)0x0;
      if (local_3a8.super_function_base.vtable == (vtable_base *)0x0) goto LAB_00245e6e;
    }
    else {
      local_3a8.super_function_base.functor._16_8_ = local_3c8.super_function_base.functor._16_8_;
      local_3a8.super_function_base.functor.members.obj_ptr =
           local_3c8.super_function_base.functor.members.obj_ptr;
      local_3a8.super_function_base.functor._8_4_ = local_3c8.super_function_base.functor._8_4_;
      local_3a8.super_function_base.functor._12_4_ = local_3c8.super_function_base.functor._12_4_;
    }
    local_378.super_function_base.vtable = local_3a8.super_function_base.vtable;
    if (((ulong)local_3a8.super_function_base.vtable & 1) == 0) {
      (*(local_3a8.super_function_base.vtable)->manager)
                (&local_3a8.super_function_base.functor,&local_378.super_function_base.functor,
                 clone_functor_tag);
    }
    else {
      local_378.super_function_base.functor._16_8_ = local_3a8.super_function_base.functor._16_8_;
      local_378.super_function_base.functor._8_8_ =
           CONCAT44(local_3a8.super_function_base.functor._12_4_,
                    local_3a8.super_function_base.functor._8_4_);
      local_378.super_function_base.functor.members.obj_ptr =
           local_3a8.super_function_base.functor.members.obj_ptr;
    }
  }
LAB_00245e6e:
  local_354 = local_384;
  local_358 = local_388;
  local_310.super_function_base.vtable = (vtable_base *)0x0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_310,
                (function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_378);
  local_2ec = local_354;
  local_2f0 = local_358;
  local_350.super_function_base.vtable = (vtable_base *)0x0;
  local_2e8.super_function_base.vtable = (vtable_base *)0x0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_2e8,
                (function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_310);
  local_2c4 = local_2ec;
  local_2c8 = local_2f0;
  local_2c0.super_function_base.vtable = (vtable_base *)0x0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_2c0,
                (function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_2e8);
  local_29c = local_2c4;
  local_2a0 = local_2c8;
  local_298.super_function_base.vtable = (vtable_base *)0x0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_298,
                (function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_2c0);
  local_274 = local_29c;
  local_278 = local_2a0;
  local_408._0_8_ = (pointer)0x0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)local_408,
                (function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_298);
  local_3e8._4_1_ = (typeinfo)local_274;
  local_3e8._0_4_ = local_278;
  ptVar5 = (typeinfo *)operator_new(0x28);
  *(undefined8 *)ptVar5 = 0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)ptVar5,
                (function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)local_408);
  ptVar5[0x24] = local_3e8._4_1_;
  *(cdr_type *)(ptVar5 + 0x20) = local_3e8._0_4_;
  local_350.super_function_base.functor.members.type.type = ptVar5;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)local_408);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_298);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_2c0);
  local_350.super_function_base.vtable =
       (vtable_base *)
       boost::
       function_n<bool,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&>
       ::
       assign_to<boost::spirit::qi::error_handler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName&,boost::fusion::nil_>,boost::fusion::vector<>>,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list5<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<lf::io::(anonymous_namespace)::MshV4GrammarText<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::ErrorHandler>,0l>,boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::spirit::argument<1>>,boost::phoenix::actor<boost::spirit::argument<2>>,boost::phoenix::actor<boost::spirit::argument<3>>>,5l>>,(boost::spirit::qi::error_handler_result)0>>(boost::spirit::qi::error_handler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName&,boost::fusion::nil_>,boost::fusion::vector<>>,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list5<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<lf::io::(anonymous_namespace)::MshV4GrammarText<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::ErrorHandler>,long>,boost::phoenix::actor<boost::spirit::argument<int>>,boost::phoenix::actor<boost::spirit::argument<int>>,boost::phoenix::actor<boost::spirit::argument<int>>,boost::phoenix::actor<boost::spirit::argument<int>>>,long>>,(boost::spirit::qi::error_handler_result)0>)
       ::stored_vtable_abi_cxx11_;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_2e8);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_310);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::swap((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
          *)&local_350,
         &this_04->
          super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
        );
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_350);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_378);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_3a8);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PhysicalName_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_3c8);
  local_3f8._8_8_ =
       (local_e8->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PhysicalName_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PhysicalName_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  local_408._0_8_ = "$PhysicalNames";
  local_3e0.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>
        )(rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
          *)0x314040;
  boost::
  function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV4::PhysicalName,_std::allocator<lf::io::GMshFileV4::PhysicalName>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&)>
  ::operator=<_650b6b73_>
            (&(this->physical_name_vector_).f,
             (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::literal_string<const_char_(&)[15],_true>,_boost::fusion::cons<boost::spirit::qi::omit_directive<boost::spirit::qi::action<boost::spirit::qi::any_uint_parser<unsigned_long_long,_10U,_1U,__1>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::local_variable<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_2L>_>_>_>,_boost::fusion::cons<boost::spirit::qi::lazy_directive<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::spirit::local_variable<0>_>_>,_2L>_>,_boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PhysicalName_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::spirit::unused_type>,_boost::fusion::cons<boost::spirit::qi::literal_string<const_char_(&)[18],_true>,_boost::fusion::nil_>_>_>_>_>,_mpl_::bool_<true>_>
              *)local_408);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"$PhyiscalNames","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
            );
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  local_3f8._0_8_ =
       (local_238->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  local_408._8_8_ =
       (local_260->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PointEntity&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PointEntity&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
               *)&(this->point_entity_).f,
              (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::any_int_parser<int,_10U,_1U,__1>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>,_boost::fusion::nil_>_>_>_>,_mpl_::bool_<true>_>
               *)local_408);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Point entity","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
            );
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  local_3f8._8_8_ =
       (local_238->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  local_408._8_8_ =
       (local_260->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  local_3f8._0_8_ = local_408._8_8_;
  local_3e8 = (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
               )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
                 )local_3f8._8_8_;
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Entity&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Entity&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
               *)&(this->entity_).f,(parser_binder<_6245d31b_> *)local_408);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"entity","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
            );
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  local_3c8.super_function_base.vtable = (vtable_base *)0x321804;
  local_310.super_function_base.vtable = (vtable_base *)&local_378;
  local_328.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_1f0.f.
          super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Nodes_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
          .super_function_base.functor;
  local_2e8.super_function_base.vtable = (vtable_base *)&local_310;
  local_170.name_._M_string_length = (size_type)local_d3;
  local_320._M_allocated_capacity = (size_type)&boost::spirit::omit;
  local_320._8_8_ = &local_330;
  local_3c8.super_function_base.functor.members.obj_ptr = &local_320;
  local_250 = (function_buffer *)((long)&local_1f0 + 0x28);
  local_248.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&boost::spirit::omit;
  local_240 = (size_type *)&local_258;
  local_350.super_function_base.functor.members.obj_ptr = &local_248;
  local_218 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)&local_1f0 + 0x20);
  local_270._M_allocated_capacity = (size_type)&boost::spirit::omit;
  local_270._8_8_ = &local_220;
  local_3a8.super_function_base.functor.members.obj_ptr = &local_270;
  local_208 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PartitionedEntity_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)&local_1f8;
  local_230._M_allocated_capacity = (size_type)&boost::spirit::omit;
  local_230._8_8_ = &local_210;
  local_378.super_function_base.functor.members.obj_ptr = &local_230;
  local_2c0.super_function_base.vtable = (vtable_base *)&local_2e8;
  local_170.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )local_d6;
  local_1f0.name_._M_string_length = (size_type)&local_178;
  local_1f0.name_.field_2._M_allocated_capacity = (size_type)local_f0;
  local_310.super_function_base.functor.members._0_8_ = (undefined8)((long)&local_1f0 + 0x10);
  local_298.super_function_base.vtable = (vtable_base *)&local_2c0;
  local_408._0_8_ = &local_298;
  local_408._8_8_ = "$EndEntities";
  local_1f0.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>
        )local_1fb;
  local_1f0.name_._M_dataplus._M_p = (pointer)local_f8;
  local_2e8.super_function_base.functor.members.obj_ptr = &local_1f0;
  local_170.name_.field_2._M_allocated_capacity = (size_type)local_f8;
  local_2c0.super_function_base.functor.members.obj_ptr = &local_170.name_._M_string_length;
  local_170.name_._M_dataplus._M_p = (pointer)local_f8;
  local_298.super_function_base.functor.members.obj_ptr = &local_170;
  local_3a8.super_function_base.vtable = (vtable_base *)&local_350;
  local_378.super_function_base.vtable = (vtable_base *)&local_3a8;
  local_350.super_function_base.vtable = (vtable_base *)&local_3c8;
  local_330.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &local_3c9;
  local_258.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &local_3c9;
  local_220.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_3c9;
  local_210.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &local_3c9;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_(),_boost::spirit::locals<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  ::define<_4e03ef3c_>(local_198);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"$Entities","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
            );
  other = &(this->entities_).f;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  local_3c8.super_function_base.vtable = (vtable_base *)0x0;
  pvVar3 = (other->
           super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
           ).super_function_base.vtable;
  if (pvVar3 == (vtable_base *)0x0) {
LAB_00246481:
    local_3a8.super_function_base.vtable = (vtable_base *)0x0;
    local_378.super_function_base.vtable = (vtable_base *)0x0;
  }
  else {
    pfVar6 = &(this->entities_).f.
              super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
              .super_function_base.functor;
    local_3c8.super_function_base.vtable = pvVar3;
    if (((ulong)pvVar3 & 1) == 0) {
      (*pvVar3->manager)(pfVar6,&local_3c8.super_function_base.functor,clone_functor_tag);
      if (local_3c8.super_function_base.vtable == (vtable_base *)0x0) goto LAB_00246481;
    }
    else {
      local_3c8.super_function_base.functor._16_8_ =
           *(undefined8 *)
            ((long)&(this->entities_).f.
                    super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                    .super_function_base.functor + 0x10);
      local_3c8.super_function_base.functor.members._0_8_ = (undefined8)*(undefined8 *)pfVar6;
      local_3c8.super_function_base.functor._8_4_ =
           *(undefined4 *)
            ((long)&(this->entities_).f.
                    super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                    .super_function_base.functor + 8);
      local_3c8.super_function_base.functor._12_4_ =
           *(undefined4 *)
            ((long)&(this->entities_).f.
                    super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                    .super_function_base.functor + 0xc);
    }
    local_3a8.super_function_base.vtable = local_3c8.super_function_base.vtable;
    if (((ulong)local_3c8.super_function_base.vtable & 1) == 0) {
      (*(local_3c8.super_function_base.vtable)->manager)
                (&local_3c8.super_function_base.functor,&local_3a8.super_function_base.functor,
                 clone_functor_tag);
      local_378.super_function_base.vtable = (vtable_base *)0x0;
      if (local_3a8.super_function_base.vtable == (vtable_base *)0x0) goto LAB_00246519;
    }
    else {
      local_3a8.super_function_base.functor._16_8_ = local_3c8.super_function_base.functor._16_8_;
      local_3a8.super_function_base.functor.members.obj_ptr =
           local_3c8.super_function_base.functor.members.obj_ptr;
      local_3a8.super_function_base.functor._8_4_ = local_3c8.super_function_base.functor._8_4_;
      local_3a8.super_function_base.functor._12_4_ = local_3c8.super_function_base.functor._12_4_;
    }
    local_378.super_function_base.vtable = local_3a8.super_function_base.vtable;
    if (((ulong)local_3a8.super_function_base.vtable & 1) == 0) {
      (*(local_3a8.super_function_base.vtable)->manager)
                (&local_3a8.super_function_base.functor,&local_378.super_function_base.functor,
                 clone_functor_tag);
    }
    else {
      local_378.super_function_base.functor._16_8_ = local_3a8.super_function_base.functor._16_8_;
      local_378.super_function_base.functor._8_8_ =
           CONCAT44(local_3a8.super_function_base.functor._12_4_,
                    local_3a8.super_function_base.functor._8_4_);
      local_378.super_function_base.functor.members.obj_ptr =
           local_3a8.super_function_base.functor.members.obj_ptr;
    }
  }
LAB_00246519:
  local_354 = local_384;
  local_358 = local_388;
  local_310.super_function_base.vtable = (vtable_base *)0x0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_310,
                (function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_378);
  local_2ec = local_354;
  local_2f0 = local_358;
  local_350.super_function_base.vtable = (vtable_base *)0x0;
  local_2e8.super_function_base.vtable = (vtable_base *)0x0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_2e8,
                (function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_310);
  local_2c4 = local_2ec;
  local_2c8 = local_2f0;
  local_2c0.super_function_base.vtable = (vtable_base *)0x0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_2c0,
                (function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_2e8);
  local_29c = local_2c4;
  local_2a0 = local_2c8;
  local_298.super_function_base.vtable = (vtable_base *)0x0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_298,
                (function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_2c0);
  local_274 = local_29c;
  local_278 = local_2a0;
  local_408._0_8_ = (pointer)0x0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)local_408,
                (function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_298);
  local_3e8._4_1_ = (typeinfo)local_274;
  local_3e8._0_4_ = local_278;
  ptVar5 = (typeinfo *)operator_new(0x28);
  *(undefined8 *)ptVar5 = 0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)ptVar5,
                (function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)local_408);
  ptVar5[0x24] = local_3e8._4_1_;
  *(cdr_type *)(ptVar5 + 0x20) = local_3e8._0_4_;
  local_350.super_function_base.functor.members.type.type = ptVar5;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)local_408);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_298);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_2c0);
  local_350.super_function_base.vtable =
       (vtable_base *)
       boost::
       function_n<bool,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,std::allocator<lf::io::GMshFileV4::PointEntity>>,std::vector<lf::io::GMshFileV4::Entity,std::allocator<lf::io::GMshFileV4::Entity>>,std::vector<lf::io::GMshFileV4::Entity,std::allocator<lf::io::GMshFileV4::Entity>>,std::vector<lf::io::GMshFileV4::Entity,std::allocator<lf::io::GMshFileV4::Entity>>>&,boost::fusion::nil_>,boost::fusion::vector<unsigned_long,unsigned_long,unsigned_long,unsigned_long>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&>
       ::
       assign_to<boost::spirit::qi::error_handler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,std::allocator<lf::io::GMshFileV4::PointEntity>>,std::vector<lf::io::GMshFileV4::Entity,std::allocator<lf::io::GMshFileV4::Entity>>,std::vector<lf::io::GMshFileV4::Entity,std::allocator<lf::io::GMshFileV4::Entity>>,std::vector<lf::io::GMshFileV4::Entity,std::allocator<lf::io::GMshFileV4::Entity>>>&,boost::fusion::nil_>,boost::fusion::vector<unsigned_long,unsigned_long,unsigned_long,unsigned_long>>,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list5<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<lf::io::(anonymous_namespace)::MshV4GrammarTe...t::phoenix::actor<boost::spirit::argument<int>>>,long>>,(boost::spirit::qi::error_handler_result)0>)
       ::stored_vtable_abi_cxx11_;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_2e8);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_310);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::swap((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
          *)&local_350,
         &other->
          super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
        );
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_350);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_378);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_3a8);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_3c8);
  boost::
  function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV4::GhostEntity,_std::allocator<lf::io::GMshFileV4::GhostEntity>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&)>
  ::
  operator=<boost::spirit::qi::detail::parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::omit_directive<boost::spirit::qi::action<boost::spirit::qi::any_uint_parser<unsigned_long_long,_10U,_1U,__1>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::local_variable<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_2L>_>_>_>,_boost::fusion::cons<boost::spirit::qi::lazy_directive<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::spirit::local_variable<0>_>_>,_2L>_>,_boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::any_int_parser<int,_10U,_1U,__1>,_boost::fusion::cons<boost::spirit::qi::any_int_parser<int,_10U,_1U,__1>,_boost::fusion::nil_>_>_>,_boost::spirit::unused_type>,_boost::fusion::nil_>_>_>,_mpl_::bool_<true>_>_>
            (&(this->ghost_entities_).f,
             (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::omit_directive<boost::spirit::qi::action<boost::spirit::qi::any_uint_parser<unsigned_long_long,_10U,_1U,__1>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::local_variable<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_2L>_>_>_>,_boost::fusion::cons<boost::spirit::qi::lazy_directive<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::spirit::local_variable<0>_>_>,_2L>_>,_boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::any_int_parser<int,_10U,_1U,__1>,_boost::fusion::cons<boost::spirit::qi::any_int_parser<int,_10U,_1U,__1>,_boost::fusion::nil_>_>_>,_boost::spirit::unused_type>,_boost::fusion::nil_>_>_>,_mpl_::bool_<true>_>
              *)local_408);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"ghost_entities","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
            );
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  local_3f8._8_8_ =
       (local_238->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  local_3e8 = (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
               )(local_260->
                super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
                ).proto_expr_.child0.ref.t_;
  local_3e0.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>
          )local_3f8._8_8_;
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PartitionedPointEntity&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PartitionedPointEntity&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
               *)&(this->partitioned_point_entity_).f,(parser_binder<_7d83649_> *)local_408);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"partitioned_point_entity","")
  ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
            );
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  local_3a8.super_function_base.vtable = (vtable_base *)&boost::spirit::int_;
  local_3a8.super_function_base.functor.members.obj_ptr = &boost::spirit::int_;
  local_378.super_function_base.functor.members.obj_ptr = &boost::spirit::int_;
  local_310.super_function_base.functor.members.obj_ptr = local_238;
  local_2e8.super_function_base.vtable = (vtable_base *)&local_310;
  local_2e8.super_function_base.functor.members.obj_ptr = local_260;
  local_2c0.super_function_base.vtable = (vtable_base *)&local_2e8;
  local_2c0.super_function_base.functor.members.obj_ptr = local_260;
  local_298.super_function_base.vtable = (vtable_base *)&local_2c0;
  local_298.super_function_base.functor.members.obj_ptr = local_238;
  local_408._0_8_ = &local_298;
  local_408._8_8_ = local_238;
  local_378.super_function_base.vtable = (vtable_base *)&local_3a8;
  local_310.super_function_base.vtable = (vtable_base *)&local_378;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,lf::io::GMshFileV4::PartitionedEntity(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::int_>const&,boost::spirit::terminal<boost::spirit::tag::int_>const&>,2l>const&,boost::spirit::terminal<boost::spirit::tag::int_>const&>,2l>const&,boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::vector<int,std::allocator<int>>,boost::spirit::lo___ost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type>&>,2l>>
            (local_190);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"partitioned_entity","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
            );
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  local_3c8.super_function_base.functor.members.obj_ptr = &local_170.name_._M_string_length;
  local_350.super_function_base.vtable = (vtable_base *)&boost::spirit::omit;
  local_350.super_function_base.functor.members.obj_ptr = &local_3c8;
  local_328.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_170;
  local_320._M_allocated_capacity = (size_type)&boost::spirit::omit;
  local_320._8_8_ = &local_330;
  local_3a8.super_function_base.vtable = (vtable_base *)&local_350;
  local_3a8.super_function_base.functor.members.obj_ptr = &local_320;
  local_250 = &local_1f0.f.
               super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Nodes_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
               .super_function_base.functor;
  local_248.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&boost::spirit::omit;
  local_240 = (size_type *)&local_258;
  local_378.super_function_base.functor.members.obj_ptr = &local_248;
  local_218 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)&local_1f0 + 0x28);
  local_270._M_allocated_capacity = (size_type)&boost::spirit::omit;
  local_270._8_8_ = &local_220;
  local_310.super_function_base.functor.members.obj_ptr = &local_270;
  local_230._M_allocated_capacity = (long)&local_1f0 + 0x20;
  local_230._8_8_ = local_110;
  local_2e8.super_function_base.vtable = (vtable_base *)&local_310;
  local_2e8.super_function_base.functor.members.obj_ptr = &local_230;
  local_210.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &local_1f8;
  local_208 = local_190;
  local_2c0.super_function_base.vtable = (vtable_base *)&local_2e8;
  local_2c0.super_function_base.functor.members.obj_ptr = &local_210;
  local_1f0.name_._M_string_length = (size_type)&local_178;
  local_1f0.name_.field_2._M_allocated_capacity = (size_type)local_190;
  local_298.super_function_base.vtable = (vtable_base *)&local_2c0;
  local_298.super_function_base.functor.members._0_8_ = (undefined8)((long)&local_1f0 + 0x10);
  local_1f0.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>
        )local_1fb;
  local_1f0.name_._M_dataplus._M_p = (pointer)local_190;
  local_408._0_8_ = &local_298;
  local_408._8_8_ = &local_1f0;
  local_3c8.super_function_base.vtable = (vtable_base *)&local_3c9;
  local_378.super_function_base.vtable = (vtable_base *)&local_3a8;
  local_330.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &local_3c9;
  local_310.super_function_base.vtable = (vtable_base *)&local_378;
  local_258.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &local_3c9;
  local_220.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_3c9;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>_(),_boost::spirit::locals<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  ::define<_eb5e74bd_>(local_1a0);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"partitioned_entities2","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
            );
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  local_3f8._8_8_ = (local_1a0->super_extends<_9e970549_>).proto_expr_.child0.ref.t_;
  local_3f8._0_8_ =
       (local_108->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV4::GhostEntity,_std::allocator<lf::io::GMshFileV4::GhostEntity>_>_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV4::GhostEntity,_std::allocator<lf::io::GMshFileV4::GhostEntity>_>_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  local_408._0_8_ = "$PartitionedEntities";
  local_3e8 = (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
               )((long)"\n$EndPartitionedEntities" + 1);
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PartitionedEntities&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::PartitionedEntities&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
               *)&(this->partitioned_entities_).f,(parser_binder<_6820b99c_> *)local_408);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"partitioned_entities","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
            );
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  local_378.super_function_base.vtable = (vtable_base *)&boost::spirit::int_;
  local_378.super_function_base.functor.members.obj_ptr = &boost::spirit::int_;
  local_310.super_function_base.functor.members.obj_ptr = &boost::spirit::int_;
  local_3c8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_350.super_function_base.functor.members.obj_ptr = &local_3c8;
  local_3a8.super_function_base.vtable = (vtable_base *)&boost::spirit::omit;
  local_3a8.super_function_base.functor.members.obj_ptr = &local_350;
  local_2e8.super_function_base.vtable = (vtable_base *)&local_310;
  local_240 = (size_type *)((long)&local_1f0 + 0x10);
  local_330.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &local_170.name_._M_string_length;
  local_328.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_248;
  local_320._M_allocated_capacity = (size_type)&boost::spirit::omit;
  local_320._8_8_ = &local_330;
  local_2c0.super_function_base.vtable = (vtable_base *)&local_2e8;
  local_2c0.super_function_base.functor.members.obj_ptr = &local_320;
  local_210.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)0x0;
  local_258.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &boost::spirit::eps;
  local_250 = (function_buffer *)&local_210;
  local_298.super_function_base.vtable = (vtable_base *)&local_2c0;
  local_298.super_function_base.functor.members.obj_ptr = &local_258;
  local_230._M_allocated_capacity = (size_type)local_260;
  local_230._8_8_ = &local_1f0;
  local_220.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_170;
  local_218 = &local_230;
  local_270._M_allocated_capacity = (size_type)&boost::spirit::omit;
  local_270._8_8_ = &local_220;
  local_408._0_8_ = &local_298;
  local_408._8_8_ = &local_270;
  local_350.super_function_base.vtable = (vtable_base *)&local_3c9;
  local_310.super_function_base.vtable = (vtable_base *)&local_378;
  local_2e8.super_function_base.functor.members.obj_ptr = (typeinfo *)&local_3a8;
  local_248.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )&local_3c9;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::NodeBlock_(),_boost::spirit::locals<unsigned_long,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  ::define<_97282753_>(local_1a8);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"node_block","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
            );
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  local_350.super_function_base.functor.members.obj_ptr = &local_320;
  local_3a8.super_function_base.vtable = (vtable_base *)&boost::spirit::omit;
  local_3a8.super_function_base.functor.members.obj_ptr = &local_350;
  local_378.super_function_base.vtable = (vtable_base *)0x313ffb;
  local_2e8.super_function_base.vtable = (vtable_base *)&local_310;
  local_2c0.super_function_base.vtable = (vtable_base *)&local_2e8;
  local_3c8.super_function_base.vtable = &local_330;
  local_3c8.super_function_base.functor.members.obj_ptr = local_1a8;
  local_298.super_function_base.vtable = (vtable_base *)&local_2c0;
  local_298.super_function_base.functor.members.obj_ptr = &local_3c8;
  local_408._0_8_ = &local_298;
  local_408._8_8_ = "$EndNodes";
  local_378.super_function_base.functor.members.obj_ptr = (typeinfo *)&local_3a8;
  local_350.super_function_base.vtable = (vtable_base *)&local_3c9;
  local_310.super_function_base.vtable = (vtable_base *)&local_378;
  local_310.super_function_base.functor.members._0_8_ = &local_3c9;
  local_2e8.super_function_base.functor.members._0_8_ = &local_3c9;
  local_2c0.super_function_base.functor.members._0_8_ = &local_3c9;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  ::define<_7e775a1_>(local_1f0.f.
                      super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Nodes_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                      .super_function_base.functor._16_8_);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"nodes","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
            );
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  boost::
  function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::ElementBlock_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&)>
  ::operator=<_aeaa06d_>(&(this->element_block_).f,(parser_binder<_285174d4_> *)local_408);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"element_block","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
            );
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  local_350.super_function_base.functor.members.obj_ptr = &local_320;
  local_3a8.super_function_base.vtable = (vtable_base *)&boost::spirit::omit;
  local_3a8.super_function_base.functor.members.obj_ptr = &local_350;
  local_378.super_function_base.vtable = (vtable_base *)0x3139d6;
  local_2e8.super_function_base.vtable = (vtable_base *)&local_310;
  local_2c0.super_function_base.vtable = (vtable_base *)&local_2e8;
  local_3c8.super_function_base.vtable = &local_330;
  local_3c8.super_function_base.functor.members.obj_ptr = local_120;
  local_298.super_function_base.vtable = (vtable_base *)&local_2c0;
  local_298.super_function_base.functor.members.obj_ptr = &local_3c8;
  local_408._0_8_ = &local_298;
  local_408._8_8_ = "$EndElements";
  local_378.super_function_base.functor.members.obj_ptr = (typeinfo *)&local_3a8;
  local_350.super_function_base.vtable = (vtable_base *)&local_3c9;
  local_310.super_function_base.vtable = (vtable_base *)&local_378;
  local_310.super_function_base.functor.members._0_8_ = &local_3c9;
  local_2e8.super_function_base.functor.members._0_8_ = &local_3c9;
  local_2c0.super_function_base.functor.members._0_8_ = &local_3c9;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Elements_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  ::define<_a5e164fa_>
            (local_1f0.f.
             super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Nodes_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
             .super_function_base.functor._8_8_);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"elements","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
            );
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<Eigen::Matrix<double,4,4,0,4,4>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<Eigen::Matrix<double,4,4,0,4,4>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
               *)&(this->matrix4d_).f,
              (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::nil_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>,_mpl_::bool_<true>_>
               *)local_408);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"matrix4d","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
            );
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  uVar4 = local_170.f.
          super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
          .super_function_base.functor._8_8_;
  local_310.super_function_base.vtable = (vtable_base *)&boost::spirit::int_;
  local_310.super_function_base.functor.members.obj_ptr = &boost::spirit::int_;
  local_2e8.super_function_base.vtable = (vtable_base *)&local_310;
  local_2e8.super_function_base.functor.members.obj_ptr = &boost::spirit::int_;
  local_3a8.super_function_base.vtable = (vtable_base *)0x3218e4;
  local_350.super_function_base.vtable = (vtable_base *)&boost::spirit::omit;
  local_270._M_local_buf[0] = 0x30;
  local_3a8.super_function_base.functor.members.obj_ptr =
       (obj_ptr_t)
       local_170.f.
       super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
       .super_function_base.functor._16_8_;
  local_378.super_function_base.vtable = (vtable_base *)&local_270;
  local_2c0.super_function_base.vtable = (vtable_base *)&local_2e8;
  local_3c8.super_function_base.functor.members.obj_ptr = &local_248;
  local_350.super_function_base.functor.members.obj_ptr = &local_3c8;
  local_298.super_function_base.vtable = (vtable_base *)&local_2c0;
  local_298.super_function_base.functor.members.obj_ptr = &local_350;
  local_320._M_allocated_capacity = (size_type)&local_258;
  local_320._8_8_ = &local_330;
  local_408._0_8_ = &local_298;
  local_408._8_8_ = &local_320;
  local_3c8.super_function_base.vtable = (vtable_base *)&local_3c9;
  local_378.super_function_base.functor.members.obj_ptr = (typeinfo *)&local_3a8;
  local_330.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &local_3c9;
  local_328.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_3c9;
  local_2c0.super_function_base.functor.members.obj_ptr = (typeinfo *)&local_378;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PeriodicLink_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  ::define<_dad39e90_>
            (local_170.f.
             super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
             .super_function_base.functor._8_8_);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"periodic_link","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
            );
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  local_3f8._8_8_ = *(undefined8 *)uVar4;
  local_408._0_8_ = "$Periodic";
  local_3e0.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>
        )((long)"\n$EndPeriodic" + 1);
  boost::
  function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV4::PeriodicLink,_std::allocator<lf::io::GMshFileV4::PeriodicLink>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&)>
  ::operator=<_348cf1c9_>(&(this->periodic_links_).f,(parser_binder<_bb89edfe_> *)local_408);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"periodic_links","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
            );
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  boost::
  function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::GhostElement_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&)>
  ::
  operator=<boost::spirit::qi::detail::parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::any_uint_parser<unsigned_long_long,_10U,_1U,__1>,_boost::fusion::cons<boost::spirit::qi::any_int_parser<int,_10U,_1U,__1>,_boost::fusion::cons<boost::spirit::qi::omit_directive<boost::spirit::qi::action<boost::spirit::qi::any_uint_parser<unsigned_long_long,_10U,_1U,__1>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<2>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::local_variable<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_2L>_>_>_>,_boost::fusion::cons<boost::spirit::qi::lazy_directive<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::spirit::local_variable<0>_>_>,_2L>_>,_boost::spirit::qi::any_int_parser<int,_10U,_1U,__1>,_boost::spirit::unused_type>,_boost::fusion::nil_>_>_>_>_>,_mpl_::bool_<true>_>_>
            (&(this->ghost_element_).f,
             (parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::any_uint_parser<unsigned_long_long,_10U,_1U,__1>,_boost::fusion::cons<boost::spirit::qi::any_int_parser<int,_10U,_1U,__1>,_boost::fusion::cons<boost::spirit::qi::omit_directive<boost::spirit::qi::action<boost::spirit::qi::any_uint_parser<unsigned_long_long,_10U,_1U,__1>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<2>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::local_variable<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_2L>_>_>_>,_boost::fusion::cons<boost::spirit::qi::lazy_directive<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::spirit::local_variable<0>_>_>,_2L>_>,_boost::spirit::qi::any_int_parser<int,_10U,_1U,__1>,_boost::spirit::unused_type>,_boost::fusion::nil_>_>_>_>_>,_mpl_::bool_<true>_>
              *)local_408);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"ghost_element","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
            );
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  local_3f8._8_8_ =
       (((extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::GhostElement_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::GhostElement_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
          *)&(local_170.f.
              super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
              .super_function_base.vtable)->manager)->proto_expr_).child0.ref.t_;
  local_408._0_8_ = "$GhostElements";
  local_3e0.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>
        )((long)"\n$EndGhostElements" + 1);
  boost::
  function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV4::GhostElement,_std::allocator<lf::io::GMshFileV4::GhostElement>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&)>
  ::operator=<_780111f1_>(&(this->ghost_elements_).f,(parser_binder<_7a57f826_> *)local_408);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"ghost_elements","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
            );
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  local_330.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       local_118;
  local_328.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_210;
  local_230._M_allocated_capacity = (size_type)&local_330;
  local_320._M_allocated_capacity = (size_type)&local_220;
  local_320._8_8_ = &local_230;
  local_3c8.super_function_base.vtable = (vtable_base *)&local_320;
  local_350.super_function_base.vtable = (vtable_base *)&local_3c8;
  local_350.super_function_base.functor.members._0_8_ = (undefined8)((long)&local_1f0 + 0x10);
  local_248.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )local_128.child0.ref.t_;
  local_240 = &local_170.name_._M_string_length;
  local_1f0.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>_>_>,_0L>
        )&local_248;
  local_3a8.super_function_base.vtable = (vtable_base *)&local_350;
  local_3a8.super_function_base.functor.members.obj_ptr = &local_1f0;
  local_310.super_function_base.functor.members.obj_ptr = &local_170;
  local_2e8.super_function_base.vtable = (vtable_base *)&local_310;
  local_2c0.super_function_base.vtable = (vtable_base *)&local_2e8;
  local_2c0.super_function_base.functor.members.obj_ptr =
       &local_1f0.f.
        super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Nodes_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
        .super_function_base.functor;
  local_258.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       local_170.f.
       super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::nil_>,_boost::fusion::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
       .super_function_base.functor.members._0_8_;
  local_250 = (function_buffer *)((long)&local_1f0 + 0x20);
  local_1f0.f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Nodes_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = &local_258;
  local_298.super_function_base.vtable = (vtable_base *)&local_2c0;
  local_298.super_function_base.functor.members._0_8_ = (undefined8)((long)&local_1f0 + 0x28);
  local_270._M_allocated_capacity = local_170.name_.field_2._8_8_;
  local_270._8_8_ = &local_178;
  local_1f8 = &local_270;
  local_408._0_8_ = &local_298;
  local_408._8_8_ = &local_1f8;
  local_220.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_100.child0.ref.t_;
  local_210.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       local_100.child0.ref.t_;
  local_3c8.super_function_base.functor.members.obj_ptr = local_198;
  local_1f0.name_._M_string_length = (size_type)local_100.child0.ref.t_;
  local_170.name_._M_string_length = (size_type)local_100.child0.ref.t_;
  local_378.super_function_base.functor.members.obj_ptr =
       (obj_ptr_t)
       local_1f0.f.
       super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Nodes_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
       .super_function_base.functor._16_8_;
  local_170.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )local_100.child0.ref.t_;
  local_2e8.super_function_base.functor.members.obj_ptr =
       (obj_ptr_t)
       local_1f0.f.
       super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Nodes_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
       .super_function_base.functor._8_8_;
  local_1f0.f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV4::Nodes_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_long>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.functor.members.obj_ptr = (obj_ptr_t)local_100.child0.ref.t_;
  local_1f0.name_.field_2._8_8_ = local_100.child0.ref.t_;
  local_178.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_100.child0.ref.t_;
  local_378.super_function_base.vtable = (vtable_base *)&local_3a8;
  local_310.super_function_base.vtable = (vtable_base *)&local_378;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_5948d700_>(local_188);
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"entry","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
            );
  other_00 = &(this->entry_).f;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  local_3c8.super_function_base.vtable = (vtable_base *)0x0;
  pvVar3 = (other_00->
           super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
           ).super_function_base.vtable;
  if (pvVar3 == (vtable_base *)0x0) {
LAB_00247603:
    local_3a8.super_function_base.vtable = (vtable_base *)0x0;
    local_378.super_function_base.vtable = (vtable_base *)0x0;
  }
  else {
    pfVar6 = &(this->entry_).f.
              super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
              .super_function_base.functor;
    local_3c8.super_function_base.vtable = pvVar3;
    if (((ulong)pvVar3 & 1) == 0) {
      (*pvVar3->manager)(pfVar6,&local_3c8.super_function_base.functor,clone_functor_tag);
      if (local_3c8.super_function_base.vtable == (vtable_base *)0x0) goto LAB_00247603;
    }
    else {
      local_3c8.super_function_base.functor._16_8_ =
           *(undefined8 *)
            ((long)&(this->entry_).f.
                    super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                    .super_function_base.functor + 0x10);
      local_3c8.super_function_base.functor.members._0_8_ = (undefined8)*(undefined8 *)pfVar6;
      local_3c8.super_function_base.functor._8_4_ =
           *(undefined4 *)
            ((long)&(this->entry_).f.
                    super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                    .super_function_base.functor + 8);
      local_3c8.super_function_base.functor._12_4_ =
           *(undefined4 *)
            ((long)&(this->entry_).f.
                    super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                    .super_function_base.functor + 0xc);
    }
    local_3a8.super_function_base.vtable = local_3c8.super_function_base.vtable;
    if (((ulong)local_3c8.super_function_base.vtable & 1) == 0) {
      (*(local_3c8.super_function_base.vtable)->manager)
                (&local_3c8.super_function_base.functor,&local_3a8.super_function_base.functor,
                 clone_functor_tag);
      local_378.super_function_base.vtable = (vtable_base *)0x0;
      if (local_3a8.super_function_base.vtable == (vtable_base *)0x0) goto LAB_0024769c;
    }
    else {
      local_3a8.super_function_base.functor._16_8_ = local_3c8.super_function_base.functor._16_8_;
      local_3a8.super_function_base.functor.members.obj_ptr =
           local_3c8.super_function_base.functor.members.obj_ptr;
      local_3a8.super_function_base.functor._8_4_ = local_3c8.super_function_base.functor._8_4_;
      local_3a8.super_function_base.functor._12_4_ = local_3c8.super_function_base.functor._12_4_;
    }
    local_378.super_function_base.vtable = local_3a8.super_function_base.vtable;
    if (((ulong)local_3a8.super_function_base.vtable & 1) == 0) {
      (*(local_3a8.super_function_base.vtable)->manager)
                (&local_3a8.super_function_base.functor,&local_378.super_function_base.functor,
                 clone_functor_tag);
    }
    else {
      local_378.super_function_base.functor._16_8_ = local_3a8.super_function_base.functor._16_8_;
      local_378.super_function_base.functor._8_8_ =
           CONCAT44(local_3a8.super_function_base.functor._12_4_,
                    local_3a8.super_function_base.functor._8_4_);
      local_378.super_function_base.functor.members.obj_ptr =
           local_3a8.super_function_base.functor.members.obj_ptr;
    }
  }
LAB_0024769c:
  local_354 = local_384;
  local_358 = local_388;
  local_310.super_function_base.vtable = (vtable_base *)0x0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_310,
                (function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_378);
  local_2ec = local_354;
  local_2f0 = local_358;
  local_350.super_function_base.vtable = (vtable_base *)0x0;
  local_2e8.super_function_base.vtable = (vtable_base *)0x0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_2e8,
                (function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_310);
  local_2c4 = local_2ec;
  local_2c8 = local_2f0;
  local_2c0.super_function_base.vtable = (vtable_base *)0x0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_2c0,
                (function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_2e8);
  local_29c = local_2c4;
  local_2a0 = local_2c8;
  local_298.super_function_base.vtable = (vtable_base *)0x0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_298,
                (function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_2c0);
  local_274 = local_29c;
  local_278 = local_2a0;
  local_408._0_8_ = (pointer)0x0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)local_408,
                (function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_298);
  local_3e8._4_1_ = (typeinfo)local_274;
  local_3e8._0_4_ = local_278;
  ptVar5 = (typeinfo *)operator_new(0x28);
  *(undefined8 *)ptVar5 = 0;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::move_assign((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)ptVar5,
                (function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)local_408);
  ptVar5[0x24] = local_3e8._4_1_;
  *(cdr_type *)(ptVar5 + 0x20) = local_3e8._0_4_;
  local_350.super_function_base.functor.members.type.type = ptVar5;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)local_408);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_298);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_2c0);
  local_350.super_function_base.vtable =
       (vtable_base *)
       boost::
       function_n<bool,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&>
       ::
       assign_to<boost::spirit::qi::error_handler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted&,boost::fusion::nil_>,boost::fusion::vector<>>,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list5<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<lf::io::(anonymous_namespace)::MshV4GrammarText<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::ErrorHandler>,0l>,boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::spirit::argument<1>>,boost::phoenix::actor<boost::spirit::argument<2>>,boost::phoenix::actor<boost::spirit::argument<3>>>,5l>>,(boost::spirit::qi::error_handler_result)0>>(boost::spirit::qi::error_handler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted&,boost::fusion::nil_>,boost::fusion::vector<>>,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list5<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<lf::io::(anonymous_namespace)::MshV4GrammarText<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::ErrorHandler>,long>,boost::phoenix::actor<boost::spirit::argument<int>>,boost::phoenix::actor<boost::spirit::argument<int>>,boost::phoenix::actor<boost::spirit::argument<int>>,boost::phoenix::actor<boost::spirit::argument<int>>>,long>>,(boost::spirit::qi::error_handler_result)0>)
       ::stored_vtable_abi_cxx11_;
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_2e8);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_310);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::swap((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
          *)&local_350,
         &other_00->
          super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
        );
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_350);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_378);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_3a8);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                 *)&local_3c8);
  return;
}

Assistant:

MshV4GrammarText() : MshV4GrammarText::base_type(entry_, "Msh File") {
    using phoenix::at_c;
    using phoenix::push_back;
    using phoenix::reserve;
    using phoenix::val;
    using qi::_val;
    using qi::attr;
    using qi::char_;
    using qi::double_;
    using qi::eps;
    using qi::int_;
    using qi::lexeme;
    using qi::lit;
    using qi::omit;
    using qi::repeat;
    using qi::labels::_1;
    using qi::labels::_2;
    using qi::labels::_3;
    using qi::labels::_4;
    using qi::labels::_a;
    using qi::labels::_b;
    using qi::labels::_c;
    using qi::labels::_d;

    auto size_t_ = qi::ulong_long;

    // General Parsers:
    quoted_string_ %= lexeme['"' >> +(char_ - '"') >> '"'];
    quoted_string_.name("string");
    vec3_ %= double_ > double_ > double_;  // NOLINT(misc-redundant-expression)
    int_vec_ %= omit[size_t_[(reserve(_val, _1), _a = _1)]] > repeat(_a)[int_];
    start_comment_ %= !lit("$PhysicalNames") >> !lit("$Entities") >>
                      !lit("$PartitionedEntities") >> !lit("$Nodes") >>
                      !lit("$Elements") >> !lit("$Periodic") >>
                      !lit("$GhostElements") >>
                      (lit('$') >> (+(char_ - qi::eol)));
    start_comment_.name("Start of Comment");
    comment_ %= start_comment_[_a = qi::_1] > *(char_ - '$') >> "$End" >>
                qi::string(_a);
    comment_.name("comment");
    qi::on_error<qi::fail>(comment_, error_handler_(_1, _2, _3, _4));

    // Physical names
    // NOLINTNEXTLINE(misc-redundant-expression)
    physical_name_ %= int_ > int_ > quoted_string_;
    physical_name_.name("Physical Name");
    qi::on_error<qi::fail>(physical_name_, error_handler_(_1, _2, _3, _4));
    physical_name_vector_ %= "$PhysicalNames" >
                             omit[size_t_[(reserve(_val, _1), _a = _1)]] >
                             repeat(_a)[physical_name_] > "$EndPhysicalNames";
    physical_name_vector_.name("$PhyiscalNames");
    /*qi::on_error<qi::fail>(physical_name_vector_,
                           error_handler_(_1, _2, _3, _4));*/

    // entities:
    point_entity_ %= int_ > vec3_ > int_vec_;
    point_entity_.name("Point entity");

    entity_ %= int_ > vec3_ > vec3_ > int_vec_ > int_vec_;
    entity_.name("entity");

    entities_ %= "$Entities" >
                 omit[size_t_[(reserve(phoenix::at_c<0>(_val), _1), _a = _1)]] >
                 omit[size_t_[(reserve(phoenix::at_c<1>(_val), _1), _b = _1)]] >
                 omit[size_t_[(reserve(phoenix::at_c<2>(_val), _1), _c = _1)]] >
                 omit[size_t_[(reserve(phoenix::at_c<3>(_val), _1), _d = _1)]] >
                 repeat(_a)[point_entity_] > repeat(_b)[entity_] >
                 repeat(_c)[entity_] > repeat(_d)[entity_] > "$EndEntities";
    entities_.name("$Entities");
    qi::on_error<qi::fail>(entities_, error_handler_(_1, _2, _3, _4));

    // PartitionedEntities
    ghost_entities_ %=
        omit[size_t_[(reserve(_val, _1), _a = _1)]] >
        repeat(_a)[int_ > int_];  // NOLINT(misc-redundant-expression)
    ghost_entities_.name("ghost_entities");
    partitioned_point_entity_ %=
        int_ > int_ > int_ > int_vec_ > vec3_ > int_vec_;  // NOLINT
    partitioned_point_entity_.name("partitioned_point_entity");

    // NOLINTNEXTLINE
    partitioned_entity_ %= int_ > int_ > int_ > int_vec_ > vec3_ > vec3_ >
                           int_vec_ > int_vec_;  // NOLINT
    partitioned_entity_.name("partitioned_entity");

    partitioned_entities2_ %=
        omit[size_t_[(reserve(at_c<0>(_val), _1), _a = _1)]] >
        omit[size_t_[(reserve(at_c<1>(_val), _1), _b = _1)]] >
        omit[size_t_[(reserve(at_c<2>(_val), _1), _c = _1)]] >
        omit[size_t_[(reserve(at_c<3>(_val), _1), _d = _1)]] >
        repeat(_a)[partitioned_point_entity_] >
        repeat(_b)[partitioned_entity_] > repeat(_c)[partitioned_entity_] >
        repeat(_d)[partitioned_entity_];
    partitioned_entities2_.name("partitioned_entities2");

    partitioned_entities_ %= "$PartitionedEntities" > size_t_ >
                             ghost_entities_ > partitioned_entities2_ >
                             "$EndPartitionedEntities";
    partitioned_entities_.name("partitioned_entities");

    // nodes:
    node_block_ %=
        int_ > int_ > int_ >  // NOLINT
        omit[size_t_[(phoenix::resize(at_c<3>(_val), _1), _a = _1, _b = 0)]] >
        omit[repeat(_a)[size_t_[at_c<0>(at_c<3>(_val)[_b++]) = _1]]] >
        eps[_b = 0] >
        omit[repeat(_a)[vec3_[at_c<1>(at_c<3>(_val)[_b++]) = _1]]];
    node_block_.name("node_block");

    nodes_ %= "$Nodes" > omit[size_t_[(reserve(at_c<3>(_val), _1), _a = _1)]] >
              size_t_ > size_t_ > size_t_ > repeat(_a)[node_block_] >
              "$EndNodes";
    nodes_.name("nodes");

    // elements:
    element_block_ %=
        int_ > int_ > int_ >  // NOLINT
        omit[size_t_[(reserve(at_c<3>(_val), _1), _a = _1)]] >
        repeat(_a)[size_t_ > repeat(numNodesAdapted(at_c<2>(_val)))[size_t_]];
    element_block_.name("element_block");

    elements_ %= "$Elements" >
                 omit[size_t_[(reserve(at_c<3>(_val), _1), _a = _1)]] >
                 size_t_ > size_t_ > size_t_ > repeat(_a)[element_block_] >
                 "$EndElements";
    elements_.name("elements");

    // periodic link
    // NOLINTNEXTLINE
    matrix4d_ %= double_ > double_ > double_ > double_ > double_ > double_ >
                 double_ > double_ > double_ > double_ > double_ > double_ >
                 double_ > double_ > double_ > double_;
    matrix4d_.name("matrix4d");

    // NOLINTNEXTLINE
    periodic_link_ %= int_ > int_ > int_ > ('0' | ("16" > matrix4d_)) >
                      omit[size_t_[(reserve(at_c<4>(_val), _1), _a = _1)]] >
                      repeat(_a)[size_t_ > size_t_];
    periodic_link_.name("periodic_link");

    periodic_links_ %= "$Periodic" >
                       omit[size_t_[(reserve(_val, _1), _a = _1)]] >
                       repeat(_a)[periodic_link_] > "$EndPeriodic";
    periodic_links_.name("periodic_links");

    // ghost elements:
    ghost_element_ %= size_t_ > int_ >
                      omit[size_t_[(reserve(at_c<2>(_val), _1), _a = _1)]] >
                      repeat(_a)[int_];
    ghost_element_.name("ghost_element");

    ghost_elements_ %= "$GhostElements" >
                       omit[size_t_[(reserve(_val, _1), _a = _1)]] >
                       repeat(_a)[ghost_element_] > "$EndGhostElements";
    ghost_elements_.name("ghost_elements");

    // The whole file
    entry_ %= *comment_ >> -(physical_name_vector_ >> *comment_) >> entities_ >>
              *comment_ >> -(partitioned_entities_ >> *comment_) >> nodes_ >>
              *comment_ >> elements_ >> *comment_ >>
              -(periodic_links_ >> *comment_) >>
              -(ghost_elements_ >> *comment_);
    entry_.name("entry");

    qi::on_error<qi::fail>(entry_, error_handler_(_1, _2, _3, _4));
  }